

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O3

void __thiscall Samba::readXmodem(Samba *this,uint8_t *buffer,int size)

{
  SerialPort *pSVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  size_t __n;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint8_t blk [133];
  char local_b8;
  char local_b7;
  byte local_b5 [128];
  undefined1 local_35;
  undefined1 local_34;
  
  if (size < 1) {
LAB_0010c079:
    iVar7 = 5;
    do {
      iVar9 = (*((this->_port)._M_t.
                 super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                 super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                 super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      if (iVar9 == 4) {
        (*pSVar1->_vptr_SerialPort[8])(pSVar1,6);
        return;
      }
      (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x15);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
LAB_0010c0a3:
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = &PTR__exception_001185a0;
    __cxa_throw(puVar5,&SambaError::typeinfo,std::exception::~exception);
  }
  iVar7 = 1;
LAB_0010bf7d:
  iVar9 = 0;
  do {
    if (iVar7 == 1) {
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x43);
    }
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    iVar4 = (*pSVar1->_vptr_SerialPort[5])(pSVar1,&local_b8,0x85);
    if (((iVar4 == 0x85) && (local_b8 == '\x01')) && (local_b7 == (char)iVar7)) {
      lVar6 = 0;
      uVar8 = 0;
      do {
        uVar3 = (uint)(ushort)((ushort)((int)uVar8 << 8) ^
                              crc16Table[(uint)local_b5[lVar6] ^ (uint)(uVar8 >> 8)]);
        uVar8 = (ulong)uVar3;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x80);
      if (CONCAT11(local_35,local_34) == uVar3) break;
    }
    if (iVar7 != 1) {
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x15);
    }
    iVar9 = iVar9 + 1;
    if (iVar9 == 5) goto LAB_0010c0a3;
  } while( true );
  if (iVar9 == 5) goto LAB_0010c0a3;
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[8])(pSVar1,6);
  __n = 0x80;
  if (size < 0x80) {
    __n = (size_t)(uint)size;
  }
  memcpy(buffer,local_b5,__n);
  buffer = buffer + 0x80;
  iVar7 = iVar7 + 1;
  bVar2 = size < 0x81;
  size = size - 0x80;
  if (bVar2) goto LAB_0010c079;
  goto LAB_0010bf7d;
}

Assistant:

void
Samba::readXmodem(uint8_t* buffer, int size)
{
    uint8_t blk[BLK_SIZE + 5];
    uint32_t blkNum = 1;
    int retries;
    int bytes;

    while (size > 0)
    {
        for (retries = 0; retries < MAX_RETRIES; retries++)
        {
            if (blkNum == 1)
                _port->put(START);

            bytes = _port->read(blk, sizeof(blk));
            if (bytes == sizeof(blk) &&
                blk[0] == SOH &&
                blk[1] == (blkNum & 0xff) &&
                crc16Check(blk))
                break;

            if (blkNum != 1)
                _port->put(NAK);
        }
        if (retries == MAX_RETRIES)
            throw SambaError();

        _port->put(ACK);

        memmove(buffer, &blk[3], min(size, BLK_SIZE));
        buffer += BLK_SIZE;
        size -= BLK_SIZE;
        blkNum++;
    }

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        if (_port->get() == EOT)
        {
            _port->put(ACK);
            break;
        }
        _port->put(NAK);
    }
    if (retries == MAX_RETRIES)
        throw SambaError();
}